

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

Iterator * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::Iterator::operator++
          (Iterator *__return_storage_ptr__,Iterator *this,int param_1)

{
  int iVar1;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *pSVar2;
  double *pdVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  
  iVar1 = this->m_index;
  uVar4 = *(undefined4 *)&this->field_0x24;
  __return_storage_ptr__->m_nonZerosInOuterDirection = this->m_nonZerosInOuterDirection;
  *(undefined4 *)&__return_storage_ptr__->field_0x24 = uVar4;
  pSVar2 = this->m_matrix;
  iVar6 = this->m_index;
  uVar4 = *(undefined4 *)&this->field_0xc;
  iVar5 = (this->m_currentTriplet).m_column;
  pdVar3 = (this->m_currentTriplet).m_value;
  (__return_storage_ptr__->m_currentTriplet).m_row = (this->m_currentTriplet).m_row;
  (__return_storage_ptr__->m_currentTriplet).m_column = iVar5;
  (__return_storage_ptr__->m_currentTriplet).m_value = pdVar3;
  __return_storage_ptr__->m_matrix = pSVar2;
  __return_storage_ptr__->m_index = iVar6;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar4;
  if (-1 < iVar1) {
    operator++(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

typename SparseMatrix<ordering>::Iterator SparseMatrix<ordering>::Iterator::operator++(int)
    {
        if (m_index < 0) {
            //Iterator is not valid. We do nothing
            return *this;
        }
        Iterator newIterator(*this);
        ++newIterator;
        return newIterator;
    }